

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O2

Status __thiscall leveldb::Env::NewAppendableFile(Env *this,string *fname,WritableFile **result)

{
  Slice local_28;
  Slice local_18;
  
  local_18.data_ = "NewAppendableFile";
  local_18.size_ = 0x11;
  local_28.data_ = (char *)*result;
  local_28.size_ = (size_t)result[1];
  Status::NotSupported((Status *)this,&local_18,&local_28);
  return (Status)(char *)this;
}

Assistant:

Status Env::NewAppendableFile(const std::string& fname, WritableFile** result) {
  return Status::NotSupported("NewAppendableFile", fname);
}